

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_library.cpp
# Opt level: O3

void __thiscall Omega_h::Library::initialize(Library *this,char *head_desc,int *argc,char ***argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  undefined8 uVar4;
  undefined8 uVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  Comm *pCVar9;
  CmdLineFlag *pCVar10;
  History *pHVar11;
  ostream *poVar12;
  long lVar13;
  string msg_str;
  string lib_desc;
  CmdLine cmdline;
  string local_268;
  string local_248;
  char local_221;
  int *local_220;
  uint local_214;
  char ***local_210;
  CommPtr local_208;
  CommPtr local_1f8;
  CommPtr local_1e8;
  long *local_1d8;
  long local_1d0;
  long local_1c8 [2];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [376];
  
  local_1d8 = local_1c8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1d8,"9.34.13-sha.dc235450+00000010000000001","");
  iVar8 = std::__cxx11::string::compare((char *)&local_1d8);
  if (iVar8 != 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"omega_h description string mismatch.\n",0x25);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"header says: ",0xd);
    poVar12 = std::operator<<((ostream *)local_1a8,head_desc);
    local_268._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,(char *)&local_268,1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"library says: ",0xe);
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,(char *)local_1d8,local_1d0);
    local_268._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,(char *)&local_268,1);
    std::__cxx11::stringbuf::str();
    fail("%s\n",local_268._M_dataplus._M_p);
  }
  local_221 = argv != (char ***)0x0 && argc != (int *)0x0;
  local_220 = argc;
  local_210 = argv;
  if ((argv != (char ***)0x0 && argc != (int *)0x0) && (0 < *argc)) {
    lVar13 = 0;
    do {
      std::__cxx11::string::string((string *)local_1b8,(*local_210)[lVar13],(allocator *)&local_268)
      ;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->argv_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8);
      if ((undefined1 *)local_1b8._0_8_ != local_1a8) {
        operator_delete((void *)local_1b8._0_8_,local_1a8._0_8_ + 1);
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < *local_220);
  }
  pCVar9 = (Comm *)operator_new(0x50);
  Comm::Comm(pCVar9,this,false,false);
  local_1b8._0_8_ = pCVar9;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Omega_h::Comm*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1b8 + 8),pCVar9);
  uVar5 = local_1b8._8_8_;
  uVar4 = local_1b8._0_8_;
  local_1b8._0_8_ = (pointer)0x0;
  local_1b8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var3 = (this->world_).super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (this->world_).super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)uVar4;
  (this->world_).super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_);
    }
  }
  pCVar9 = (Comm *)operator_new(0x50);
  Comm::Comm(pCVar9,this,false,false);
  local_1b8._0_8_ = pCVar9;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Omega_h::Comm*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1b8 + 8),pCVar9);
  uVar5 = local_1b8._8_8_;
  uVar4 = local_1b8._0_8_;
  local_1b8._0_8_ = (pointer)0x0;
  local_1b8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var3 = (this->self_).super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (this->self_).super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)uVar4;
  (this->self_).super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_);
    }
  }
  CmdLine::CmdLine((CmdLine *)local_1b8);
  paVar1 = &local_268.field_2;
  local_268._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"--osh-memory","");
  paVar2 = &local_248.field_2;
  local_248._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_248,"print amount and stacktrace of max memory use","");
  CmdLine::add_flag((CmdLine *)local_1b8,&local_268,&local_248);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != paVar2) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar1) {
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
  }
  local_268._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"--osh-time","");
  local_248._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_248,"print amount of time spend in certain functions","");
  CmdLine::add_flag((CmdLine *)local_1b8,&local_268,&local_248);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != paVar2) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar1) {
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
  }
  local_268._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"--osh-time-percent","");
  local_248._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_248,"print amount of time spend in certain functions by percentage",""
            );
  CmdLine::add_flag((CmdLine *)local_1b8,&local_268,&local_248);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != paVar2) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar1) {
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
  }
  local_268._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"--osh-time-chop","");
  local_248._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_248,
             "only print functions whose percent time is greater than given value (e.g. --osh-time-chop=2)"
             ,"");
  pCVar10 = CmdLine::add_flag((CmdLine *)local_1b8,&local_268,&local_248);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != paVar2) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar1) {
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
  }
  local_268._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"0.0","");
  local_248._M_dataplus._M_p = (pointer)0x0;
  CmdLineFlag::add_arg<double>(pCVar10,&local_268,(double *)&local_248);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar1) {
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
  }
  local_268._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_268,"--osh-time-with-filename","");
  local_248._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_248,"add file name to function name in profile output","");
  CmdLine::add_flag((CmdLine *)local_1b8,&local_268,&local_248);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != paVar2) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar1) {
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
  }
  local_268._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"--osh-signal","");
  local_248._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_248,"catch signals and print a stacktrace","");
  CmdLine::add_flag((CmdLine *)local_1b8,&local_268,&local_248);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != paVar2) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar1) {
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
  }
  local_268._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"--osh-fpe","");
  local_248._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_248,"enable floating-point exceptions","");
  CmdLine::add_flag((CmdLine *)local_1b8,&local_268,&local_248);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != paVar2) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar1) {
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
  }
  local_268._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"--osh-silent","");
  local_248._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"suppress all output","");
  CmdLine::add_flag((CmdLine *)local_1b8,&local_268,&local_248);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != paVar2) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar1) {
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
  }
  local_268._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"--osh-pool","");
  local_248._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"use memory pooling","");
  CmdLine::add_flag((CmdLine *)local_1b8,&local_268,&local_248);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != paVar2) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar1) {
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
  }
  local_268._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"--osh-self-send","");
  local_248._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_248,"control self send threshold","");
  pCVar10 = CmdLine::add_flag((CmdLine *)local_1b8,&local_268,&local_248);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != paVar2) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar1) {
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
  }
  local_268._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"value","");
  local_248._M_dataplus._M_p = local_248._M_dataplus._M_p & 0xffffffff00000000;
  CmdLineFlag::add_arg<int>(pCVar10,&local_268,(int *)&local_248);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar1) {
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
  }
  local_268._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_268,"--osh-mpi-ranks-per-node","");
  local_248._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_248,"mpi ranks per node (for CUDA+MPI)","");
  pCVar10 = CmdLine::add_flag((CmdLine *)local_1b8,&local_268,&local_248);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != paVar2) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar1) {
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
  }
  local_268._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"value","");
  local_248._M_dataplus._M_p = local_248._M_dataplus._M_p & 0xffffffff00000000;
  CmdLineFlag::add_arg<int>(pCVar10,&local_268,(int *)&local_248);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar1) {
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
  }
  if (local_221 != '\0') {
    local_1e8.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (this->world_).super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_1e8.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (this->world_).super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi;
    if (local_1e8.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_1e8.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ->_M_use_count =
             (local_1e8.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_1e8.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ->_M_use_count =
             (local_1e8.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
      }
    }
    bVar6 = CmdLine::parse((CmdLine *)local_1b8,&local_1e8,local_220,*local_210);
    if (!bVar6) {
      fail("assertion %s failed at %s +%d\n","cmdline.parse(world_, argc, *argv)",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_library.cpp"
           ,0x77);
    }
    if (local_1e8.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1e8.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi);
    }
  }
  local_268._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_268,"--osh-time-with-filename","");
  bVar6 = CmdLine::parsed((CmdLine *)local_1b8,&local_268);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar1) {
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
  }
  local_268._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"--osh-time-chop","");
  local_248._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"0.0","");
  local_220 = (int *)CmdLine::get<double>((CmdLine *)local_1b8,&local_268,&local_248);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != paVar2) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar1) {
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
  }
  local_268._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"--osh-time","");
  bVar7 = CmdLine::parsed((CmdLine *)local_1b8,&local_268);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar1) {
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
  }
  if (bVar7) {
    pHVar11 = (History *)operator_new(0x70);
    local_1f8.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (this->world_).super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_1f8.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (this->world_).super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi;
    if (local_1f8.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_1f8.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ->_M_use_count =
             (local_1f8.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_1f8.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ->_M_use_count =
             (local_1f8.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
      }
    }
    profile::History::History(pHVar11,&local_1f8,false,(double)local_220,bVar6);
    profile::global_singleton_history = pHVar11;
    if (local_1f8.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1f8.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi);
    }
  }
  local_268._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"--osh-time-percent","");
  bVar7 = CmdLine::parsed((CmdLine *)local_1b8,&local_268);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar1) {
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
  }
  if (bVar7) {
    pHVar11 = (History *)operator_new(0x70);
    local_208.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (this->world_).super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_208.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (this->world_).super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi;
    if (local_208.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_208.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ->_M_use_count =
             (local_208.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_208.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ->_M_use_count =
             (local_208.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
      }
    }
    profile::History::History(pHVar11,&local_208,true,(double)local_220,bVar6);
    profile::global_singleton_history = pHVar11;
    if (local_208.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_208.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi);
    }
  }
  local_268._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"--osh-fpe","");
  bVar6 = CmdLine::parsed((CmdLine *)local_1b8,&local_268);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar1) {
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
  }
  if (bVar6) {
    local_248._M_dataplus._M_p._0_4_ = MXCSR;
    MXCSR = MXCSR & 0xffffff7f;
    local_214 = MXCSR;
  }
  this->self_send_threshold_ = 1000000;
  local_268._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"--osh-self-send","");
  bVar6 = CmdLine::parsed((CmdLine *)local_1b8,&local_268);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar1) {
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
  }
  if (bVar6) {
    local_268._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"--osh-self-send","");
    local_248._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"value","");
    iVar8 = CmdLine::get<int>((CmdLine *)local_1b8,&local_268,&local_248);
    this->self_send_threshold_ = iVar8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != paVar2) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != paVar1) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
  }
  local_268._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"--osh-silent","");
  bVar6 = CmdLine::parsed((CmdLine *)local_1b8,&local_268);
  this->silent_ = bVar6;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar1) {
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
  }
  local_268._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"--osh-signal","");
  bVar6 = CmdLine::parsed((CmdLine *)local_1b8,&local_268);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar1) {
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
  }
  if (bVar6) {
    protect();
  }
  local_268._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"--osh-pool","");
  bVar6 = CmdLine::parsed((CmdLine *)local_1b8,&local_268);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar1) {
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
  }
  if (bVar6) {
    enable_pooling();
  }
  std::
  vector<std::unique_ptr<Omega_h::CmdLineFlag,_std::default_delete<Omega_h::CmdLineFlag>_>,_std::allocator<std::unique_ptr<Omega_h::CmdLineFlag,_std::default_delete<Omega_h::CmdLineFlag>_>_>_>
  ::~vector((vector<std::unique_ptr<Omega_h::CmdLineFlag,_std::default_delete<Omega_h::CmdLineFlag>_>,_std::allocator<std::unique_ptr<Omega_h::CmdLineFlag,_std::default_delete<Omega_h::CmdLineFlag>_>_>_>
             *)(local_1a8 + 8));
  std::
  vector<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>,_std::allocator<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>_>_>
  ::~vector((vector<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>,_std::allocator<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>_>_>
             *)local_1b8);
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8,local_1c8[0] + 1);
  }
  return;
}

Assistant:

void Library::initialize(char const* head_desc, int* argc, char*** argv
#ifdef OMEGA_H_USE_MPI
    ,
    MPI_Comm comm_mpi
#endif
) {
  std::string lib_desc = OMEGA_H_SEMVER;
  if (lib_desc != head_desc) {
    std::stringstream msg;
    msg << "omega_h description string mismatch.\n";
    msg << "header says: " << head_desc << '\n';
    msg << "library says: " << lib_desc << '\n';
    std::string msg_str = msg.str();
    Omega_h::fail("%s\n", msg_str.c_str());
  }
  if (argc && argv) {
    for (int ic = 0; ic < *argc; ic++) {
      argv_.push_back((*argv)[ic]);
    }
  }
#ifdef OMEGA_H_USE_MPI
  int mpi_is_init;
  OMEGA_H_CHECK(MPI_SUCCESS == MPI_Initialized(&mpi_is_init));
  if (!mpi_is_init) {
    OMEGA_H_CHECK(MPI_SUCCESS == MPI_Init(argc, argv));
    we_called_mpi_init = true;
  } else {
    we_called_mpi_init = false;
  }
  MPI_Comm world_dup;
  MPI_Comm_dup(comm_mpi, &world_dup);
  world_ = CommPtr(new Comm(this, world_dup));

#ifdef OMEGA_H_DBG
  DBG_COMM = world_.get();
#endif

#else
  world_ = CommPtr(new Comm(this, false, false));
  self_ = CommPtr(new Comm(this, false, false));
#endif
  Omega_h::CmdLine cmdline;
  cmdline.add_flag(
      "--osh-memory", "print amount and stacktrace of max memory use");
  cmdline.add_flag(
      "--osh-time", "print amount of time spend in certain functions");
  cmdline.add_flag(
      "--osh-time-percent", "print amount of time spend in certain functions by percentage");
  auto& osh_time_chop_flag = cmdline.add_flag(
      "--osh-time-chop", "only print functions whose percent time is greater than given value (e.g. --osh-time-chop=2)");
  osh_time_chop_flag.add_arg<double>("0.0");
  cmdline.add_flag("--osh-time-with-filename", "add file name to function name in profile output");

  cmdline.add_flag("--osh-signal", "catch signals and print a stacktrace");
  cmdline.add_flag("--osh-fpe", "enable floating-point exceptions");
  cmdline.add_flag("--osh-silent", "suppress all output");
  cmdline.add_flag("--osh-pool", "use memory pooling");
  auto& self_send_flag =
      cmdline.add_flag("--osh-self-send", "control self send threshold");
  self_send_flag.add_arg<int>("value");
  auto& mpi_ranks_flag =
      cmdline.add_flag("--osh-mpi-ranks-per-node", "mpi ranks per node (for CUDA+MPI)");
  mpi_ranks_flag.add_arg<int>("value");
  if (argc && argv) {
    OMEGA_H_CHECK(cmdline.parse(world_, argc, *argv));
  }
  bool add_filename = false;
  if (cmdline.parsed("--osh-time-with-filename")) {
    add_filename = true;
  }
  double chop = cmdline.get<double>("--osh-time-chop", "0.0");
  if (cmdline.parsed("--osh-time")) {
    Omega_h::profile::global_singleton_history =
      new Omega_h::profile::History(world_, false, chop, add_filename);
  }
  if (cmdline.parsed("--osh-time-percent")) {
    Omega_h::profile::global_singleton_history =
      new Omega_h::profile::History(world_, true, chop, add_filename);
  }
  if (cmdline.parsed("--osh-fpe")) {
    enable_floating_point_exceptions();
  }
  self_send_threshold_ = 1000 * 1000;
  if (cmdline.parsed("--osh-self-send")) {
    self_send_threshold_ = cmdline.get<int>("--osh-self-send", "value");
  }
  silent_ = cmdline.parsed("--osh-silent");
#ifdef OMEGA_H_USE_KOKKOS
  if (!Kokkos::is_initialized()) {
    OMEGA_H_CHECK(argc != nullptr);
    OMEGA_H_CHECK(argv != nullptr);
    Kokkos::initialize(*argc, *argv);
    we_called_kokkos_init = true;
  } else {
    we_called_kokkos_init = false;
  }
#endif
#if defined(OMEGA_H_USE_CUDA) && defined(OMEGA_H_USE_MPI) \
  && (!defined(OMEGA_H_USE_KOKKOS))
  if (cmdline.parsed("--osh-mpi-ranks-per-node")) {
    int rank, ndevices_per_node, my_device;
    MPI_Comm_rank(MPI_COMM_WORLD, &rank);
    cudaGetDeviceCount(&ndevices_per_node);
    int mpi_ranks_per_node =
      cmdline.get<int>("--osh-mpi-ranks-per-node", "value");
    int local_mpi_rank = rank % mpi_ranks_per_node;
    cudaSetDevice(local_mpi_rank);
    cudaGetDevice(&my_device);
    PCOUT("ndevices_per_node= " << ndevices_per_node << " mpi_ranks_per_node= " << mpi_ranks_per_node << " local_mpi_rank= " << local_mpi_rank << std::endl);
    OMEGA_H_CHECK_OP(mpi_ranks_per_node, ==, ndevices_per_node);
    OMEGA_H_CHECK_OP(my_device, ==, local_mpi_rank);
  }
#endif
  if (cmdline.parsed("--osh-signal")) Omega_h::protect();
#if defined(OMEGA_H_USE_CUDA) && (!defined(OMEGA_H_USE_KOKKOS))
  // trigger lazy initialization of the CUDA runtime
  // and prevent it from polluting later timings
  cudaFree(nullptr);
#endif
  if (cmdline.parsed("--osh-pool")) enable_pooling();
}